

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seismogram.cpp
# Opt level: O1

void __thiscall
CombinedSeismogramm<float,_3>::Load
          (CombinedSeismogramm<float,_3> *this,SeismoType type,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *paths)

{
  pointer pcVar1;
  float *pfVar2;
  long lVar3;
  double dVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar5;
  int iVar6;
  uint uVar7;
  pointer pbVar8;
  ostream *poVar9;
  pointer pSVar10;
  ulong uVar11;
  ulong uVar12;
  vector<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_> *pvVar13;
  IndexType k;
  uint uVar14;
  pointer pSVar15;
  long lVar16;
  ulong uVar17;
  uint uVar18;
  long lVar19;
  uint16 uVar20;
  ulong uVar21;
  float fVar22;
  float fVar23;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  line;
  string filename;
  vector<float,_std::allocator<float>_> rec_y;
  vector<float,_std::allocator<float>_> rec_x;
  string filename_source;
  string filename_rec;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v_1;
  ifstream ifs_source;
  ifstream ifs_rec;
  ifstream ifs;
  ifstream ifs0;
  float local_9c4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_9c0;
  long *local_9a8;
  long local_9a0;
  long local_998 [2];
  ulong local_988;
  float local_97c;
  ulong local_978;
  ulong local_970;
  ulong local_968;
  ulong local_960;
  vector<float,_std::allocator<float>_> local_958;
  vector<float,_std::allocator<float>_> local_938;
  ulong local_920;
  long local_918;
  long *local_910 [2];
  long local_900 [2];
  ulong local_8f0;
  CombinedSeismogramm<float,_3> *local_8e8;
  ulong local_8e0;
  pointer local_8d8;
  vector<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_> *local_8d0;
  long *local_8c8 [2];
  long local_8b8 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_8a8;
  long local_8a0;
  ulong local_898;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_890;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_878;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_860;
  byte abStack_840 [488];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_658;
  byte abStack_638 [496];
  pointer local_448;
  pointer pbStack_440;
  pointer local_438;
  long local_238 [4];
  byte abStack_218 [488];
  
  pvVar13 = &this->seismogramms;
  std::vector<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>::resize
            (pvVar13,((long)(this->componentInfos).
                            super__Vector_base<CombinedSeismogramm<float,_3>::ComponentInfo,_std::allocator<CombinedSeismogramm<float,_3>::ComponentInfo>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->componentInfos).
                            super__Vector_base<CombinedSeismogramm<float,_3>::ComponentInfo,_std::allocator<CombinedSeismogramm<float,_3>::ComponentInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333);
  if (type == CSV) {
    local_8d0 = pvVar13;
    std::vector<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>::resize
              (pvVar13,((long)(paths->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(paths->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start >> 5) * 3);
    pbVar8 = (paths->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((paths->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish != pbVar8) {
      local_918 = 0;
      local_920 = 0;
      local_8e8 = this;
      local_8a8 = paths;
      do {
        local_9a8 = local_998;
        lVar19 = local_920 * 0x20;
        pcVar1 = pbVar8[local_920]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_9a8,pcVar1,pcVar1 + pbVar8[local_920]._M_string_length);
        std::__cxx11::string::append((char *)&local_9a8);
        std::ifstream::ifstream((istream *)local_238);
        std::ifstream::open((char *)local_238,(_Ios_Openmode)local_9a8);
        if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) != 0) goto LAB_0010a566;
        local_8a0 = lVar19;
        getNextLineAndSplitIntoTokens_abi_cxx11_(&local_9c0,(istream *)local_238,';');
        uVar14 = (uint)((long)local_9c0.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_9c0.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5);
        uVar18 = uVar14 - 1;
        iVar6 = std::__cxx11::string::compare
                          ((char *)(local_9c0.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish + -1));
        uVar7 = uVar18;
        if (iVar6 != 0) {
          uVar7 = uVar14;
        }
        local_8f0 = (ulong)uVar7;
        local_988 = 0xffffffff;
        local_970 = (ulong)uVar18;
        if (local_8f0 <=
            (ulong)((long)local_9c0.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_9c0.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5)) {
          local_988 = 0xffffffff;
          do {
            getNextLineAndSplitIntoTokens_abi_cxx11_(&local_658,(istream *)local_238,';');
            local_438 = local_9c0.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
            pbStack_440 = local_9c0.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
            local_448 = local_9c0.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            local_9c0.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 local_658.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            local_9c0.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_658.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            local_9c0.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 local_658.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            local_658.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_658.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_658.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_448);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_658);
            local_988 = (ulong)((int)local_988 + 1);
          } while (local_8f0 <=
                   (ulong)((long)local_9c0.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_9c0.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 5));
        }
        std::ifstream::close();
        std::ifstream::ifstream((istream *)&local_448);
        std::ifstream::open((char *)&local_448,(_Ios_Openmode)local_9a8);
        getNextLineAndSplitIntoTokens_abi_cxx11_(&local_878,(istream *)&local_448,';');
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_878);
        getNextLineAndSplitIntoTokens_abi_cxx11_(&local_860,(istream *)&local_448,';');
        local_658.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             local_9c0.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_658.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_9c0.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_658.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             local_9c0.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_978 = local_970 * 0xaaaaaaab >> 0x21;
        local_9c0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             local_860.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_9c0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_860.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_9c0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             local_860.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_860.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_860.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_860.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_658);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_860);
        lVar19 = 0;
        do {
          uVar21 = (ulong)(uint)((int)local_918 + (int)lVar19);
          pSVar10 = (this->seismogramms).
                    super__Vector_base<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          uVar11 = ((long)(this->seismogramms).
                          super__Vector_base<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar10 >> 6) *
                   0x6db6db6db6db6db7;
          if (uVar11 < uVar21 || uVar11 - uVar21 == 0) goto LAB_0010a545;
          std::
          vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
          ::resize(&pSVar10[uVar21].data,
                   (((long)local_9c0.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_9c0.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 5) - 1U) / 3);
          lVar19 = lVar19 + 1;
        } while (lVar19 != 3);
        uVar11 = local_988 & 0xffffffff;
        if (2 < (uint)local_970) {
          iVar6 = (int)local_978;
          uVar21 = 0;
          do {
            lVar19 = 0;
            do {
              uVar17 = (ulong)(uint)((int)local_918 + (int)lVar19);
              pSVar10 = (this->seismogramms).
                        super__Vector_base<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              uVar12 = ((long)(this->seismogramms).
                              super__Vector_base<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar10 >> 6) *
                       0x6db6db6db6db6db7;
              if (uVar12 < uVar17 || uVar12 - uVar17 == 0) {
                std::__throw_out_of_range_fmt
                          (
                          "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                          );
                uVar21 = local_960;
                goto LAB_0010a52f;
              }
              std::vector<float,_std::allocator<float>_>::resize
                        ((vector<float,_std::allocator<float>_> *)
                         (uVar21 * 0x18 +
                         *(long *)&pSVar10[uVar17].data.
                                   super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                   ._M_impl),uVar11);
              lVar19 = lVar19 + 1;
            } while (lVar19 != 3);
            uVar21 = uVar21 + 1;
          } while (uVar21 != iVar6 + (uint)(iVar6 == 0));
        }
        std::vector<float,_std::allocator<float>_>::resize(&this->times,uVar11);
        if (local_8f0 <=
            (ulong)((long)local_9c0.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_9c0.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5)) {
          iVar6 = (int)local_920;
          local_898 = (ulong)(uint)(iVar6 * 3);
          local_960 = (ulong)(iVar6 * 3 + 1);
          local_968 = (ulong)(iVar6 * 3 + 2);
          local_8e0 = (ulong)((int)local_978 + (uint)((int)local_978 == 0)) * 0x18;
          uVar14 = 0;
          do {
            pbVar8 = local_9c0.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            dVar4 = atof(((local_9c0.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p);
            uVar12 = (ulong)uVar14;
            (this->times).super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start[uVar12] = (float)dVar4;
            if (2 < (uint)local_970) {
              pSVar10 = (local_8e8->seismogramms).
                        super__Vector_base<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              uVar11 = ((long)(local_8e8->seismogramms).
                              super__Vector_base<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar10 >> 6) *
                       0x6db6db6db6db6db7;
              uVar21 = local_898;
              if (uVar11 < local_898 || uVar11 - local_898 == 0) goto LAB_0010a52f;
              local_8d8 = pSVar10 + local_960;
              pSVar15 = pSVar10 + local_968;
              lVar19 = *(long *)&pSVar10[local_898].data.
                                 super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                 ._M_impl;
              uVar17 = 0;
              do {
                dVar4 = atof(*(char **)((long)&pbVar8[1]._M_dataplus._M_p + uVar17 * 4));
                *(float *)(*(long *)(lVar19 + uVar17) + uVar12 * 4) = (float)dVar4;
                uVar21 = local_960;
                if (uVar11 < local_960 || uVar11 - local_960 == 0) goto LAB_0010a52f;
                dVar4 = atof(*(char **)((long)&pbVar8[2]._M_dataplus._M_p + uVar17 * 4));
                *(float *)(*(long *)(*(long *)&(local_8d8->data).
                                               super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                               ._M_impl + uVar17) + uVar12 * 4) = (float)dVar4;
                uVar21 = local_968;
                if (uVar11 < local_968 || uVar11 - local_968 == 0) goto LAB_0010a52f;
                dVar4 = atof(*(char **)((long)&pbVar8[3]._M_dataplus._M_p + uVar17 * 4));
                *(float *)(*(long *)(*(long *)&(pSVar15->data).
                                               super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                               ._M_impl + uVar17) + uVar12 * 4) = (float)dVar4;
                uVar17 = uVar17 + 0x18;
              } while (local_8e0 != uVar17);
            }
            getNextLineAndSplitIntoTokens_abi_cxx11_(&local_860,(istream *)&local_448,';');
            local_658.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 local_9c0.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            local_658.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_9c0.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            local_658.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 local_9c0.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            local_9c0.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 local_860.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            local_9c0.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_860.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            local_9c0.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 local_860.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            local_860.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_860.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_860.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_658);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_860);
            uVar14 = uVar14 + 1;
            this = local_8e8;
          } while (local_8f0 <=
                   (ulong)((long)local_9c0.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_9c0.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 5));
        }
        uVar11 = (ulong)((int)local_988 - 1);
        pfVar2 = (this->times).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
        interpolate_data_on_equal_time_intervals
                  (this,((pfVar2[uVar11] - *pfVar2) / (float)uVar11) *
                        this->interpolation_multiplier);
        pfVar2 = (this->times).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar14 = (uint)(*(int *)&(this->times).super__Vector_base<float,_std::allocator<float>_>.
                                 _M_impl.super__Vector_impl_data._M_finish - (int)pfVar2) >> 2;
        dVar4 = floor((double)(pfVar2[1] - *pfVar2) * 1000000.0 + 0.5);
        lVar19 = local_918;
        uVar11 = local_978;
        lVar16 = 0;
        do {
          uVar7 = (int)lVar16 + (int)lVar19;
          pSVar10 = (local_8d0->
                    super__Vector_base<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          pSVar10[uVar7].header_data.job_id = 1;
          pSVar10[uVar7].header_data.line_num = 1;
          pSVar10[uVar7].header_data.reel_num = 1;
          pSVar10[uVar7].header_data.num_of_traces_per_record = (uint16)uVar11;
          pSVar10[uVar7].header_data.num_of_auxiliary_traces_per_record = 0;
          uVar20 = (uint16)(long)dVar4;
          pSVar10[uVar7].header_data.sample_interval_reel = uVar20;
          pSVar10[uVar7].header_data.sample_interval = uVar20;
          uVar20 = (uint16)uVar14;
          pSVar10[uVar7].header_data.samples_per_trace_reel = uVar20;
          pSVar10[uVar7].header_data.samples_per_trace = uVar20;
          pSVar10[uVar7].header_data.data_sample_format = 5;
          lVar16 = lVar16 + 1;
          memset(pSVar10[uVar7].header_data.other,0,0x176);
          pvVar5 = local_8a8;
        } while (lVar16 != 3);
        local_960 = CONCAT44(local_960._4_4_,uVar14);
        pbVar8 = (local_8a8->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        local_8c8[0] = local_8b8;
        lVar19 = *(long *)((long)&(pbVar8->_M_dataplus)._M_p + local_8a0);
        local_968 = (long)dVar4;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_8c8,lVar19,
                   *(long *)((long)&pbVar8->_M_string_length + local_8a0) + lVar19);
        std::__cxx11::string::append((char *)local_8c8);
        std::ifstream::ifstream((istream *)&local_658);
        std::ifstream::open((char *)&local_658,(_Ios_Openmode)local_8c8[0]);
        local_938.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_938.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish = (float *)0x0;
        local_938.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (float *)0x0;
        local_958.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (float *)0x0;
        local_958.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_958.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish = (float *)0x0;
        if ((abStack_638
             [local_658.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[-1]._M_string_length] & 5) == 0) {
          if (2 < (uint)local_970) {
            iVar6 = (int)local_978 + (uint)((int)local_978 == 0);
            do {
              getNextLineAndSplitIntoTokens_abi_cxx11_(&local_860,(istream *)&local_658,';');
              if ((ulong)((long)local_860.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_860.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) < 0x21) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"Error while reading receivers data",0x22);
                std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
                std::ostream::put('@');
                std::ostream::flush();
              }
              else {
                dVar4 = atof(((local_860.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p);
                local_910[0] = (long *)CONCAT44(local_910[0]._4_4_,(float)dVar4);
                if (local_938.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_finish ==
                    local_938.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                            (&local_938,
                             (iterator)
                             local_938.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_finish,(float *)local_910);
                }
                else {
                  *local_938.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish = (float)dVar4;
                  local_938.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       local_938.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish + 1;
                }
                if ((ulong)((long)local_860.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_860.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 5) < 2)
                goto LAB_0010a553;
                dVar4 = atof(local_860.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p);
                local_910[0] = (long *)CONCAT44(local_910[0]._4_4_,(float)dVar4);
                if (local_958.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_finish ==
                    local_958.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                            (&local_958,
                             (iterator)
                             local_958.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_finish,(float *)local_910);
                }
                else {
                  *local_958.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish = (float)dVar4;
                  local_958.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       local_958.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish + 1;
                }
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_860);
              iVar6 = iVar6 + -1;
            } while (iVar6 != 0);
          }
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Warning: no csv receivers data found",0x24);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
          std::ostream::put('@');
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "         All receivers positions have been set to (0.0, 0.0)",0x3c);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
          std::ostream::put('@');
          std::ostream::flush();
          if (2 < (uint)local_970) {
            iVar6 = (int)local_978 + (uint)((int)local_978 == 0);
            do {
              local_860.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   (pointer)((ulong)local_860.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
              if (local_938.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_938.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                          (&local_938,
                           (iterator)
                           local_938.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_finish,(float *)&local_860);
              }
              else {
                *local_938.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish = 0.0;
                local_938.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_938.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
              local_860.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   (pointer)((ulong)local_860.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
              if (local_958.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_958.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                          (&local_958,
                           (iterator)
                           local_958.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_finish,(float *)&local_860);
              }
              else {
                *local_958.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish = 0.0;
                local_958.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_958.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
              iVar6 = iVar6 + -1;
            } while (iVar6 != 0);
          }
        }
        pbVar8 = (pvVar5->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        local_910[0] = local_900;
        lVar19 = *(long *)((long)&(pbVar8->_M_dataplus)._M_p + local_8a0);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_910,lVar19,
                   *(long *)((long)&pbVar8->_M_string_length + local_8a0) + lVar19);
        std::__cxx11::string::append((char *)local_910);
        uVar11 = local_978;
        std::ifstream::ifstream((istream *)&local_860);
        std::ifstream::open((char *)&local_860,(_Ios_Openmode)local_910[0]);
        if ((abStack_840
             [local_860.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[-1]._M_string_length] & 5) == 0) {
          getNextLineAndSplitIntoTokens_abi_cxx11_(&local_890,(istream *)&local_860,';');
          pbVar8 = local_890.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if ((ulong)((long)local_890.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_890.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) < 0x21) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Error while reading source data",0x1f);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
            std::ostream::put('@');
            std::ostream::flush();
          }
          else {
            dVar4 = atof(((local_890.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p);
            local_9c4 = (float)dVar4;
            dVar4 = atof(pbVar8[1]._M_dataplus._M_p);
            local_97c = (float)dVar4;
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_890);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Warning: no csv source data found",0x21);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
          std::ostream::put('@');
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"         Source position has been set to (0.0, 0.0)",
                     0x33);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
          std::ostream::put('@');
          std::ostream::flush();
          local_9c4 = 0.0;
          local_97c = 0.0;
        }
        local_8e0 = (ulong)(uint)((int)local_920 * 3);
        iVar6 = (int)uVar11;
        local_988 = uVar11 & 0xffffffff;
        lVar19 = (long)local_97c;
        pSVar10 = (pointer)0x0;
        do {
          pvVar13 = local_8d0;
          uVar14 = (int)local_8e0 + (int)pSVar10;
          local_8d8 = pSVar10;
          std::vector<segy_trace_header,_std::allocator<segy_trace_header>_>::resize
                    (&(local_8d0->
                      super__Vector_base<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>).
                      _M_impl.super__Vector_impl_data._M_start[uVar14].trace_header_data,local_988);
          if (2 < (uint)local_970) {
            lVar16 = 0x1d;
            uVar11 = 0;
            do {
              lVar3 = *(long *)&(pvVar13->
                                super__Vector_base<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>
                                )._M_impl.super__Vector_impl_data._M_start[uVar14].trace_header_data
                                .
                                super__Vector_base<segy_trace_header,_std::allocator<segy_trace_header>_>
                                ._M_impl;
              *(int *)(lVar3 + -0x74 + lVar16 * 4) = (int)uVar11;
              *(int *)(lVar3 + -0x70 + lVar16 * 4) = (int)uVar11;
              *(short *)(lVar3 + -0x58 + lVar16 * 4) = (short)uVar11;
              fVar22 = local_938.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar11];
              *(int *)(lVar3 + -0x24 + lVar16 * 4) = (int)(long)fVar22;
              fVar23 = local_958.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar11];
              *(int *)(lVar3 + -0x20 + lVar16 * 4) = (int)(long)fVar23;
              *(int *)(lVar3 + -0x2c + lVar16 * 4) = (int)(long)local_9c4;
              *(int *)(lVar3 + -0x28 + lVar16 * 4) = (int)lVar19;
              *(undefined8 *)(lVar3 + -0x6c + lVar16 * 4) = 0x100000001;
              *(short *)(lVar3 + -2 + lVar16 * 4) = (short)local_960;
              *(short *)(lVar3 + lVar16 * 4) = (short)local_968;
              *(undefined2 *)(lVar3 + -0x1c + lVar16 * 4) = 1;
              fVar22 = fVar22 - local_9c4;
              fVar23 = fVar23 - local_97c;
              dVar4 = (double)(fVar22 * fVar22 + fVar23 * fVar23) + 0.5;
              if (dVar4 < 0.0) {
                dVar4 = sqrt(dVar4);
              }
              else {
                dVar4 = SQRT(dVar4);
              }
              *(int *)(*(long *)&(local_8d0->
                                 super__Vector_base<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start[uVar14].
                                 trace_header_data.
                                 super__Vector_base<segy_trace_header,_std::allocator<segy_trace_header>_>
                                 ._M_impl + -0x50 + lVar16 * 4) = (int)(long)dVar4;
              uVar11 = uVar11 + 1;
              lVar16 = lVar16 + 0x3c;
              pvVar13 = local_8d0;
            } while (iVar6 + (uint)(iVar6 == 0) != uVar11);
          }
          this = local_8e8;
          pSVar10 = (pointer)((long)&(local_8d8->data).
                                     super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                     ._M_impl + 1);
        } while (pSVar10 != (pointer)0x3);
        std::ifstream::~ifstream(&local_860);
        if (local_910[0] != local_900) {
          operator_delete(local_910[0],local_900[0] + 1);
        }
        pvVar5 = local_8a8;
        if (local_958.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_958.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_958.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_958.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (local_938.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_938.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_938.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_938.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        std::ifstream::~ifstream(&local_658);
        if (local_8c8[0] != local_8b8) {
          operator_delete(local_8c8[0],local_8b8[0] + 1);
        }
        std::ifstream::~ifstream(&local_448);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_9c0);
        std::ifstream::~ifstream(local_238);
        if (local_9a8 != local_998) {
          operator_delete(local_9a8,local_998[0] + 1);
        }
        local_920 = (ulong)((int)local_920 + 1);
        pbVar8 = (pvVar5->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        local_918 = local_918 + 3;
      } while (local_920 <
               (ulong)((long)(pvVar5->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5));
    }
  }
  else if ((type == SEG_Y) &&
          (pbVar8 = (paths->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start,
          (paths->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish != pbVar8)) {
    uVar14 = 1;
    uVar11 = 0;
    do {
      Seismogramm<float>::LoadSegY
                ((this->seismogramms).
                 super__Vector_base<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>.
                 _M_impl.super__Vector_impl_data._M_start + uVar11,pbVar8 + uVar11,&this->times);
      uVar11 = (ulong)uVar14;
      pbVar8 = (paths->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar14 = uVar14 + 1;
    } while (uVar11 < (ulong)((long)(paths->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5)
            );
  }
  return;
LAB_0010a52f:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar21,
             uVar11);
LAB_0010a545:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_0010a553:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",1);
LAB_0010a566:
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Error in reading CSV file.",0x1a);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"There is no such file: ",0x17);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_9a8,local_9a0);
  std::endl<char,std::char_traits<char>>(poVar9);
  exit(1);
}

Assistant:

void CombinedSeismogramm<Scalar, dims>::Load(SeismoType type, std::vector<std::string> paths)
{
    seismogramms.resize(componentInfos.size());
    if (type == SEG_Y)
    {
        for (IndexType p = 0; p < paths.size(); ++p)
        {
            seismogramms[p].LoadSegY(paths[p], times);
        }
    }
    else if (type == CSV)
    {
        seismogramms.resize(paths.size() * dims);
        for (IndexType path_index = 0; path_index < paths.size(); path_index++)
        {
            // Calculating number of time steps and number of traces
            // ///////////////////////////////////////
            std::string filename = paths[path_index] + ".csv";
            IndexType num_of_times = -1;
            IndexType num_of_all_traces = 0;
            IndexType num_of_receivers;
            std::ifstream ifs0;
            ifs0.open(filename.c_str());
            if (!ifs0)
            {
                std::cout << "Error in reading CSV file." << std::endl;
                std::cout << "There is no such file: " << filename << std::endl;
                std::exit(1);
            }
            std::vector<std::string> line = getNextLineAndSplitIntoTokens(ifs0);
            num_of_all_traces = line.size() - 1;
            num_of_receivers = num_of_all_traces / dims;
            if (line.back() == "\r") num_of_all_traces -= 1;
            while (line.size() >= num_of_all_traces + 1)
            {
                line = getNextLineAndSplitIntoTokens(ifs0);
                num_of_times++;
            }
            ifs0.close();

            // Reading  data
            // ///////////////////////////////////////
            std::ifstream ifs;
            ifs.open(filename.c_str());
            getNextLineAndSplitIntoTokens(ifs);

            line = getNextLineAndSplitIntoTokens(ifs);

            for (int k = 0; k < dims; k++)
                seismogramms.at(dims * path_index + k).data.resize((line.size()-1)/dims);

            for (int trace_i = 0; trace_i < num_of_receivers; trace_i++)
            {
                for (int k = 0; k < dims; k++)
                    seismogramms.at(dims * path_index + k).data[trace_i].resize(num_of_times);
            }
            times.resize(num_of_times);

            IndexType time_i = 0;
            while (line.size() >= num_of_all_traces + 1)
            {
                times[time_i] = ::atof(line[0].c_str());
                for (int trace_i = 0; trace_i < num_of_receivers; trace_i++)
                {
                    seismogramms.at(dims * path_index + 0).data[trace_i][time_i] = ::atof(line[1 + trace_i * dims].c_str());
                    seismogramms.at(dims * path_index + 1).data[trace_i][time_i] = ::atof(line[2 + trace_i * dims].c_str());
                    if (dims >= 3)
                        seismogramms.at(dims * path_index + 2).data[trace_i][time_i] = ::atof(line[3 + trace_i * dims].c_str());
                }
                line = getNextLineAndSplitIntoTokens(ifs);
                time_i++;
            }

            // Interpolating results on eqidistant time grid
            // ///////////////////////////////////////

            Scalar interval = (times[num_of_times-1] - times[0]) / (num_of_times - 1);
            interpolate_data_on_equal_time_intervals(interval * interpolation_multiplier);
            num_of_times = times.size();
            interval = times[1] - times[0];


            // Set binary header data
            // ///////////////////////////////////////
            struct segy_bin_header_data header_data;
            header_data.sample_interval = (uint32)(floor(interval * 1000000.0 + 0.5));
            header_data.sample_interval_reel = header_data.sample_interval;


            header_data.job_id = 1;
            header_data.line_num = 1;
            header_data.reel_num = 1;
            header_data.num_of_traces_per_record = num_of_receivers;
            header_data.num_of_auxiliary_traces_per_record = 0;
            header_data.data_sample_format = 5;
            header_data.reel_num = 1;
            header_data.samples_per_trace = num_of_times;
            header_data.samples_per_trace_reel = header_data.samples_per_trace;
            for (int i = 0; i < 17; i++)
                header_data.other[i] = 0;
            for (int i = 0; i < 170; i++)
                header_data.reserve[i] = 0;

            for (IndexType k = 0; k < dims; k++)
            {
                seismogramms[dims*path_index + k].header_data = header_data;
            }



            // Set trace header data
            // ///////////////////////////////////////

            // Reading receivers data
            std::string filename_rec = paths[path_index] + ".receivers.csv";
            std::ifstream ifs_rec;
            ifs_rec.open(filename_rec.c_str());
            std::vector<Scalar> rec_x;
            std::vector<Scalar> rec_y;
            if (ifs_rec)
            {
                for (IndexType i = 0; i < num_of_receivers; i++)
                {
                    std::vector<std::string> v = getNextLineAndSplitIntoTokens(ifs_rec);
                    if (v.size() < 2)
                    {
                        std::cout << "Error while reading receivers data" << std::endl;
                    }
                    else
                    {
                        rec_x.push_back(::atof(v.at(0).c_str()));
                        rec_y.push_back(::atof(v.at(1).c_str()));
                    }
                }
            }
            else
            {
                std::cout << "Warning: no csv receivers data found" << std::endl;
                std::cout << "         All receivers positions have been set to (0.0, 0.0)" << std::endl;
                for (IndexType i = 0; i < num_of_receivers; i++)
                {
                    rec_x.push_back(0.0);
                    rec_y.push_back(0.0);
                }
            }

            // Reading source data
            std::string filename_source = paths[path_index] + ".source.csv";
            std::ifstream ifs_source;
            ifs_source.open(filename_source.c_str());
            Scalar source_x;
            Scalar source_y;
            if (ifs_source)
            {
                std::vector<std::string> v = getNextLineAndSplitIntoTokens(ifs_source);
                if (v.size() < 2)
                {
                    std::cout << "Error while reading source data" << std::endl;
                }
                else
                {
                    source_x = ::atof(v.at(0).c_str());
                    source_y = ::atof(v.at(1).c_str());
                }
            }
            else
            {
                std::cout << "Warning: no csv source data found" << std::endl;
                std::cout << "         Source position has been set to (0.0, 0.0)" << std::endl;
                source_x = 0.0;
                source_y = 0.0;
            }

            // Setting trace headers data

            for (IndexType k = 0; k < dims; k++)
            {
                seismogramms[dims*path_index + k].trace_header_data.resize(num_of_receivers);
                for (int i = 0; i < num_of_receivers; i++)
                {
                    seismogramms[dims*path_index + k].trace_header_data[i].trace_seq_num_line = i;
                    seismogramms[dims*path_index + k].trace_header_data[i].trace_seq_num_reel = i;
                    seismogramms[dims*path_index + k].trace_header_data[i].trace_id_code = i;
                    seismogramms[dims*path_index + k].trace_header_data[i].receiver_x = rec_x[i];
                    seismogramms[dims*path_index + k].trace_header_data[i].receiver_y = rec_y[i];
                    seismogramms[dims*path_index + k].trace_header_data[i].source_x = source_x;
                    seismogramms[dims*path_index + k].trace_header_data[i].source_y = source_y;
                    seismogramms[dims*path_index + k].trace_header_data[i].field_record_num = 1;
                    seismogramms[dims*path_index + k].trace_header_data[i].num_of_samples = header_data.samples_per_trace;
                    seismogramms[dims*path_index + k].trace_header_data[i].sample_interval = header_data.sample_interval;
                    seismogramms[dims*path_index + k].trace_header_data[i].trace_num_reel = 1;
                    seismogramms[dims*path_index + k].trace_header_data[i].units_id = 1;
                    seismogramms[dims*path_index + k].trace_header_data[i].distance_from_source =
                            uint32(sqrt(Scalar((rec_x[i]-source_x)*(rec_x[i]-source_x) + (rec_y[i]-source_y)*(rec_y[i]-source_y)) + 0.5));
                }
            }


        }
    }
}